

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::dragLeaveEvent(QGraphicsView *this,QDragLeaveEvent *event)

{
  bool bVar1;
  QFlagsStorage<Qt::MouseButton> actions;
  QFlagsStorage<Qt::DropAction> QVar2;
  QGraphicsViewPrivate *this_00;
  QObject *pQVar3;
  long *in_RSI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  QGraphicsSceneDragDropEvent sceneEvent;
  QWidget *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  Type in_stack_ffffffffffffff8c;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsView *)0xa3d270);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3d286);
  if ((bVar1) && ((*(uint *)&this_00->field_0x300 & 1) != 0)) {
    if (this_00->lastDragDropEvent == (QGraphicsSceneDragDropEvent *)0x0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,
                 (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff84,(char *)in_stack_ffffffffffffff78);
      QMessageLogger::warning
                (local_28,"QGraphicsView::dragLeaveEvent: drag leave received before drag enter");
    }
    else {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
                ((QGraphicsSceneDragDropEvent *)this_00,in_stack_ffffffffffffff8c);
      QGraphicsSceneDragDropEvent::scenePos
                ((QGraphicsSceneDragDropEvent *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      QGraphicsSceneDragDropEvent::setScenePos
                ((QGraphicsSceneDragDropEvent *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (QPointF *)in_stack_ffffffffffffff78);
      QGraphicsSceneDragDropEvent::screenPos
                ((QGraphicsSceneDragDropEvent *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      QGraphicsSceneDragDropEvent::setScreenPos
                ((QGraphicsSceneDragDropEvent *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (QPoint *)in_stack_ffffffffffffff78);
      actions.i = (Int)QGraphicsSceneDragDropEvent::buttons
                                 ((QGraphicsSceneDragDropEvent *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      QGraphicsSceneDragDropEvent::setButtons
                ((QGraphicsSceneDragDropEvent *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (MouseButtons)actions.i);
      QGraphicsSceneDragDropEvent::modifiers
                ((QGraphicsSceneDragDropEvent *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      QGraphicsSceneDragDropEvent::setModifiers
                ((QGraphicsSceneDragDropEvent *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (KeyboardModifiers)actions.i);
      QVar2.i = (Int)QGraphicsSceneDragDropEvent::possibleActions
                               ((QGraphicsSceneDragDropEvent *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      QGraphicsSceneDragDropEvent::setPossibleActions
                ((QGraphicsSceneDragDropEvent *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80),
                 (DropActions)actions.i);
      QGraphicsSceneDragDropEvent::proposedAction
                ((QGraphicsSceneDragDropEvent *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80));
      QGraphicsSceneDragDropEvent::setProposedAction
                ((QGraphicsSceneDragDropEvent *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80),
                 (DropAction)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      QGraphicsSceneDragDropEvent::dropAction
                ((QGraphicsSceneDragDropEvent *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80));
      QGraphicsSceneDragDropEvent::setDropAction
                ((QGraphicsSceneDragDropEvent *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80),
                 (DropAction)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      QGraphicsSceneDragDropEvent::mimeData
                ((QGraphicsSceneDragDropEvent *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80));
      QGraphicsSceneDragDropEvent::setMimeData
                ((QGraphicsSceneDragDropEvent *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80),
                 (QMimeData *)in_stack_ffffffffffffff78);
      QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0xa3d434);
      QGraphicsSceneEvent::setWidget
                ((QGraphicsSceneEvent *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      QGraphicsSceneDragDropEvent::source
                ((QGraphicsSceneDragDropEvent *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80));
      QGraphicsSceneDragDropEvent::setSource
                ((QGraphicsSceneDragDropEvent *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      if (this_00->lastDragDropEvent != (QGraphicsSceneDragDropEvent *)0x0) {
        (**(code **)(*(long *)&this_00->lastDragDropEvent->super_QGraphicsSceneEvent + 8))();
      }
      this_00->lastDragDropEvent = (QGraphicsSceneDragDropEvent *)0x0;
      pQVar3 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3d4a0)->
                super_QObject;
      QCoreApplication::sendEvent(pQVar3,(QEvent *)&local_40);
      bVar1 = QEvent::isAccepted((QEvent *)&local_40);
      if (bVar1) {
        (**(code **)(*in_RSI + 0x10))(in_RSI,1);
      }
      QGraphicsSceneDragDropEvent::~QGraphicsSceneDragDropEvent
                ((QGraphicsSceneDragDropEvent *)0xa3d4d7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::dragLeaveEvent(QDragLeaveEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed)
        return;
    if (!d->lastDragDropEvent) {
        qWarning("QGraphicsView::dragLeaveEvent: drag leave received before drag enter");
        return;
    }

    // Generate a scene event.
    QGraphicsSceneDragDropEvent sceneEvent(QEvent::GraphicsSceneDragLeave);
    sceneEvent.setScenePos(d->lastDragDropEvent->scenePos());
    sceneEvent.setScreenPos(d->lastDragDropEvent->screenPos());
    sceneEvent.setButtons(d->lastDragDropEvent->buttons());
    sceneEvent.setModifiers(d->lastDragDropEvent->modifiers());
    sceneEvent.setPossibleActions(d->lastDragDropEvent->possibleActions());
    sceneEvent.setProposedAction(d->lastDragDropEvent->proposedAction());
    sceneEvent.setDropAction(d->lastDragDropEvent->dropAction());
    sceneEvent.setMimeData(d->lastDragDropEvent->mimeData());
    sceneEvent.setWidget(d->lastDragDropEvent->widget());
    sceneEvent.setSource(d->lastDragDropEvent->source());
    delete d->lastDragDropEvent;
    d->lastDragDropEvent = nullptr;

    // Send it to the scene.
    QCoreApplication::sendEvent(d->scene, &sceneEvent);

    // Accept the originating event if the scene accepted the scene event.
    if (sceneEvent.isAccepted())
        event->setAccepted(true);
}